

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScript * BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                    (opcodetype *inputs,int *inputs_1,opcodetype *inputs_2,opcodetype *inputs_3,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs_4,
                    opcodetype *inputs_5)

{
  long lVar1;
  anon_class_16_2_441f04d1 *in_RDI;
  long in_FS_OFFSET;
  CScript *ret;
  int cnt;
  CScript *in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript(in_stack_ffffffffffffff28);
  BuildScript<opcodetype,_int,_opcodetype,_opcodetype,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_opcodetype>
  ::anon_class_16_2_441f04d1::operator()(in_RDI,(opcodetype *)in_stack_ffffffffffffff30);
  BuildScript<opcodetype,_int,_opcodetype,_opcodetype,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_opcodetype>
  ::anon_class_16_2_441f04d1::operator()(in_RDI,(int *)in_stack_ffffffffffffff30);
  BuildScript<opcodetype,_int,_opcodetype,_opcodetype,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_opcodetype>
  ::anon_class_16_2_441f04d1::operator()(in_RDI,(opcodetype *)in_stack_ffffffffffffff30);
  BuildScript<opcodetype,_int,_opcodetype,_opcodetype,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_opcodetype>
  ::anon_class_16_2_441f04d1::operator()(in_RDI,(opcodetype *)in_stack_ffffffffffffff30);
  BuildScript<opcodetype,_int,_opcodetype,_opcodetype,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_opcodetype>
  ::anon_class_16_2_441f04d1::operator()(in_RDI,in_stack_ffffffffffffff30);
  BuildScript<opcodetype,_int,_opcodetype,_opcodetype,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_opcodetype>
  ::anon_class_16_2_441f04d1::operator()(in_RDI,(opcodetype *)in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (CScript *)in_RDI;
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}